

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O1

astcenc_error astcenc_get_block_info(astcenc_context *ctxo,uint8_t *data,astcenc_block_info *info)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  block_size_descriptor *this;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  long lVar19;
  uint uVar20;
  bool bVar21;
  ulong uVar22;
  float (*paafVar23) [2] [4];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  bool a_hdr;
  symbolic_compressed_block scb;
  int weight_plane1 [216];
  int weight_plane2 [216];
  bool local_8b9;
  decimation_info *local_8b8;
  block_mode *local_8b0;
  partition_info *local_8a8;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 local_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined2 local_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined2 uStack_838;
  undefined2 uStack_836;
  undefined2 uStack_834;
  undefined2 uStack_832;
  undefined4 local_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 local_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  undefined4 local_7d0;
  undefined4 uStack_7cc;
  undefined4 uStack_7c8;
  undefined4 uStack_7c4;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 local_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  symbolic_compressed_block local_7a0;
  vint4 local_720;
  vint4 local_710 [53];
  bool local_3c0 [912];
  
  auVar32 = in_ZMM5._0_32_;
  physical_to_symbolic((ctxo->context).bsd,data,&local_7a0);
  this = (ctxo->context).bsd;
  memset(info,0,0x860);
  info->profile = (ctxo->context).config.profile;
  uVar18 = (ctxo->context).config.block_y;
  info->block_x = (ctxo->context).config.block_x;
  info->block_y = uVar18;
  info->block_z = (ctxo->context).config.block_z;
  info->texel_count = (uint)this->texel_count;
  info->is_error_block = local_7a0.block_type == 0;
  if ((local_7a0.block_type != 0) &&
     (info->is_constant_block = local_7a0.block_type < 3, local_7a0.block_type >= 3)) {
    local_8a8 = block_size_descriptor::get_partition_info
                          (this,(uint)local_7a0.partition_count,(uint)local_7a0.partition_index);
    uVar3 = this->block_mode_packed_index[local_7a0.block_mode];
    if ((uVar3 == 0xffff) ||
       (this->block_mode_count_all < (uint)uVar3 || this->block_mode_count_all == (uint)uVar3)) {
      __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                    ,0x27f,
                    "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const");
    }
    local_8b0 = this->block_modes + uVar3;
    bVar2 = this->block_modes[uVar3].decimation_mode;
    uVar4._0_1_ = this->decimation_tables[bVar2].weight_x;
    uVar4._1_1_ = this->decimation_tables[bVar2].weight_y;
    auVar5 = vpmovzxbd_avx(ZEXT216(uVar4));
    info->weight_x = (int)auVar5._0_8_;
    info->weight_y = (int)((ulong)auVar5._0_8_ >> 0x20);
    info->weight_z = (uint)this->decimation_tables[bVar2].weight_z;
    info->is_dual_plane_block = (bool)(this->block_modes[uVar3].field_0x5 & 1);
    info->partition_count = (uint)local_7a0.partition_count;
    info->partition_index = (uint)local_7a0.partition_index;
    info->dual_plane_component = (int)local_7a0.plane2_component;
    uVar20 = 0;
    uVar18 = 0;
    if ((ulong)local_7a0.quant_mode < 0x15) {
      uVar18 = *(uint *)(&DAT_0032ccd4 + (ulong)local_7a0.quant_mode * 4);
    }
    info->color_level_count = uVar18;
    uVar22 = (ulong)this->block_modes[uVar3].quant_mode;
    if (uVar22 < 0x15) {
      uVar20 = *(uint *)(&DAT_0032ccd4 + uVar22 * 4);
    }
    local_8b8 = this->decimation_tables + bVar2;
    info->weight_level_count = uVar20;
    if (local_7a0.partition_count != 0) {
      paafVar23 = info->color_endpoints;
      uVar22 = 0;
      local_7b0 = 0x9e;
      uStack_7ac = 0x9e;
      uStack_7a8 = 0x9e;
      uStack_7a4 = 0x9e;
      local_7c0 = 0x20;
      uStack_7bc = 0x20;
      uStack_7b8 = 0x20;
      uStack_7b4 = 0x20;
      local_7d0 = 0xffff;
      uStack_7cc = 0xffff;
      uStack_7c8 = 0xffff;
      uStack_7c4 = 0xffff;
      local_7e0 = 0x7ffffc00;
      uStack_7dc = 0x7ffffc00;
      uStack_7d8 = 0x7ffffc00;
      uStack_7d4 = 0x7ffffc00;
      local_7f0 = 0x7ff;
      uStack_7ec = 0x7ff;
      uStack_7e8 = 0x7ff;
      uStack_7e4 = 0x7ff;
      local_800 = 0x1ff;
      uStack_7fc = 0x1ff;
      uStack_7f8 = 0x1ff;
      uStack_7f4 = 0x1ff;
      local_840 = 5;
      uStack_83e = 5;
      uStack_83c = 5;
      uStack_83a = 5;
      uStack_838 = 5;
      uStack_836 = 5;
      uStack_834 = 5;
      uStack_832 = 5;
      local_850 = 0xfffff800;
      uStack_84c = 0xfffff800;
      uStack_848 = 0xfffff800;
      uStack_844 = 0xfffff800;
      local_860 = 0x7bff;
      uStack_85c = 0x7bff;
      uStack_858 = 0x7bff;
      uStack_854 = 0x7bff;
      local_870 = 0x38000000;
      uStack_86c = 0x38000000;
      uStack_868 = 0x38000000;
      uStack_864 = 0x38000000;
      local_880 = 0x3ff;
      uStack_87c = 0x3ff;
      uStack_878 = 0x3ff;
      uStack_874 = 0x3ff;
      local_890 = 0x7800;
      uStack_88c = 0x7800;
      uStack_888 = 0x7800;
      uStack_884 = 0x7800;
      local_8a0 = 0x3c00;
      uStack_89c = 0x3c00;
      uStack_898 = 0x3c00;
      uStack_894 = 0x3c00;
      local_810 = 3;
      uStack_80c = 3;
      uStack_808 = 3;
      uStack_804 = 3;
      local_820 = 0x5ff;
      uStack_81c = 0x5ff;
      uStack_818 = 0x5ff;
      uStack_814 = 0x5ff;
      local_830 = 0xfffffe00;
      uStack_82c = 0xfffffe00;
      uStack_828 = 0xfffffe00;
      uStack_824 = 0xfffffe00;
      do {
        unpack_color_endpoints
                  ((ctxo->context).config.profile,(uint)local_7a0.color_formats[uVar22],
                   local_7a0.color_formats + uVar22 * 8 + 0xc,local_3c0,&local_8b9,&local_720,
                   local_710);
        auVar5._4_4_ = uStack_82c;
        auVar5._0_4_ = local_830;
        auVar5._8_4_ = uStack_828;
        auVar5._12_4_ = uStack_824;
        auVar15._4_4_ = uStack_81c;
        auVar15._0_4_ = local_820;
        auVar15._8_4_ = uStack_818;
        auVar15._12_4_ = uStack_814;
        auVar16._4_4_ = uStack_80c;
        auVar16._0_4_ = local_810;
        auVar16._8_4_ = uStack_808;
        auVar16._12_4_ = uStack_804;
        info->color_endpoint_modes[uVar22] = (uint)local_7a0.color_formats[uVar22];
        bVar21 = local_8b9;
        if (((info->is_hdr_block | local_3c0[0]) & 1U) != 0) {
          bVar21 = true;
        }
        info->is_hdr_block = bVar21;
        uVar18 = -(local_3c0[0] & 1);
        auVar24 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
        auVar24 = vpinsrd_avx(auVar24,uVar18,2);
        auVar24 = vpinsrd_avx(auVar24,-(uint)local_8b9,3);
        lVar19 = 0;
        auVar14._2_2_ = uStack_83e;
        auVar14._0_2_ = local_840;
        auVar14._4_2_ = uStack_83c;
        auVar14._6_2_ = uStack_83a;
        auVar14._8_2_ = uStack_838;
        auVar14._10_2_ = uStack_836;
        auVar14._12_2_ = uStack_834;
        auVar14._14_2_ = uStack_832;
        auVar13._4_4_ = uStack_84c;
        auVar13._0_4_ = local_850;
        auVar13._8_4_ = uStack_848;
        auVar13._12_4_ = uStack_844;
        auVar12._4_4_ = uStack_85c;
        auVar12._0_4_ = local_860;
        auVar12._8_4_ = uStack_858;
        auVar12._12_4_ = uStack_854;
        auVar11._4_4_ = uStack_86c;
        auVar11._0_4_ = local_870;
        auVar11._8_4_ = uStack_868;
        auVar11._12_4_ = uStack_864;
        auVar10._4_4_ = uStack_87c;
        auVar10._0_4_ = local_880;
        auVar10._8_4_ = uStack_878;
        auVar10._12_4_ = uStack_874;
        auVar9._4_4_ = uStack_88c;
        auVar9._0_4_ = local_890;
        auVar9._8_4_ = uStack_888;
        auVar9._12_4_ = uStack_884;
        auVar8._4_4_ = uStack_89c;
        auVar8._0_4_ = local_8a0;
        auVar8._8_4_ = uStack_898;
        auVar8._12_4_ = uStack_894;
        do {
          auVar1 = *(undefined1 (*) [16])((long)local_720.m + lVar19);
          auVar27._4_4_ = uStack_7ec;
          auVar27._0_4_ = local_7f0;
          auVar27._8_4_ = uStack_7e8;
          auVar27._12_4_ = uStack_7e4;
          auVar25 = vpand_avx(auVar1,auVar27);
          auVar29 = vpcmpgtd_avx(auVar25,auVar15);
          auVar27 = vpslld_avx(auVar25,2);
          auVar27 = vpaddd_avx(auVar5,auVar27);
          auVar28 = vpmaddwd_avx(auVar25,auVar14);
          auVar28 = vpaddd_avx(auVar28,auVar13);
          auVar27 = vblendvps_avx(auVar27,auVar28,auVar29);
          auVar28 = vpsrld_avx(auVar1,8);
          auVar28 = vpandn_avx(auVar28,auVar1);
          auVar28 = vcvtdq2ps_avx(auVar28);
          auVar28 = vpsrld_avx(auVar28,0x17);
          auVar17._4_4_ = uStack_7ac;
          auVar17._0_4_ = local_7b0;
          auVar17._8_4_ = uStack_7a8;
          auVar17._12_4_ = uStack_7a4;
          auVar28 = vpsubd_avx(auVar17,auVar28);
          auVar28 = vpmaxsd_avx(auVar28,_DAT_0027d060);
          auVar29._4_4_ = uStack_7bc;
          auVar29._0_4_ = local_7c0;
          auVar29._8_4_ = uStack_7b8;
          auVar29._12_4_ = uStack_7b4;
          auVar29 = vpminsd_avx(auVar28,auVar29);
          auVar28._4_4_ = uStack_7fc;
          auVar28._0_4_ = local_800;
          auVar28._8_4_ = uStack_7f8;
          auVar28._12_4_ = uStack_7f4;
          auVar28 = vpcmpgtd_avx(auVar25,auVar28);
          auVar25 = vpmaddwd_avx(auVar16,auVar25);
          auVar27 = vblendvps_avx(auVar25,auVar27,auVar28);
          auVar25._4_4_ = uStack_7cc;
          auVar25._0_4_ = local_7d0;
          auVar25._8_4_ = uStack_7c8;
          auVar25._12_4_ = uStack_7c4;
          auVar25 = vpcmpeqd_avx(auVar1,auVar25);
          auVar28 = vpslld_avx(auVar29,0x17);
          auVar28 = vpaddd_avx(auVar11,auVar28);
          auVar31._0_4_ = (int)auVar28._0_4_;
          auVar31._4_4_ = (int)auVar28._4_4_;
          auVar31._8_4_ = (int)auVar28._8_4_;
          auVar31._12_4_ = (int)auVar28._12_4_;
          auVar28 = vpmulld_avx(auVar31,auVar1);
          auVar28 = vpsrld_avx(auVar28,6);
          auVar28 = vpand_avx(auVar10,auVar28);
          auVar29 = vpslld_avx(auVar29,10);
          auVar28 = vpsubd_avx(auVar28,auVar29);
          auVar28 = vpaddd_avx(auVar9,auVar28);
          auVar28 = vblendvps_avx(auVar28,auVar8,auVar25);
          auVar25 = vpcmpgtd_avx(auVar1,auVar16);
          auVar29 = vpslld_avx(auVar1,8);
          auVar32 = ZEXT1632(auVar29);
          auVar28 = vblendvps_avx(auVar29,auVar28,auVar25);
          auVar25 = vpsrld_avx(auVar1,1);
          auVar1._4_4_ = uStack_7dc;
          auVar1._0_4_ = local_7e0;
          auVar1._8_4_ = uStack_7d8;
          auVar1._12_4_ = uStack_7d4;
          auVar1 = vpand_avx(auVar25,auVar1);
          auVar27 = vpsrld_avx(auVar27,3);
          auVar1 = vpor_avx(auVar27,auVar1);
          auVar1 = vpminsd_avx(auVar1,auVar12);
          auVar1 = vpblendvb_avx(auVar28,auVar1,auVar24);
          auVar1 = vpackssdw_avx(auVar1,auVar1);
          auVar1 = vcvtph2ps_f16c(auVar1);
          *(undefined1 (*) [16])((long)(*paafVar23)[0] + lVar19) = auVar1;
          lVar19 = lVar19 + 0x10;
        } while (lVar19 == 0x10);
        uVar22 = uVar22 + 1;
        paafVar23 = paafVar23 + 1;
      } while (uVar22 < local_7a0.partition_count);
    }
    unpack_weights(this,&local_7a0,local_8b8,(bool)(local_8b0->field_0x5 & 1),(int *)&local_720,
                   (int *)local_3c0);
    bVar2 = this->texel_count;
    if ((ulong)bVar2 != 0) {
      lVar19 = (ulong)bVar2 - 1;
      auVar30._8_8_ = lVar19;
      auVar30._0_8_ = lVar19;
      auVar30._16_8_ = lVar19;
      auVar30._24_8_ = lVar19;
      bVar21 = info->is_dual_plane_block;
      auVar24[1] = 0;
      auVar24[0] = bVar21;
      auVar24[2] = bVar21;
      auVar24[3] = 0;
      auVar24[4] = bVar21;
      auVar24[5] = 0;
      auVar24[6] = bVar21;
      auVar24[7] = 0;
      auVar24[8] = bVar21;
      auVar24[9] = 0;
      auVar24[10] = bVar21;
      auVar24[0xb] = 0;
      auVar24[0xc] = bVar21;
      auVar24[0xd] = 0;
      auVar24[0xe] = bVar21;
      auVar24[0xf] = 0;
      uVar22 = 0;
      auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar7 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      auVar26._16_8_ = 0x8000000000000000;
      auVar26._24_8_ = 0x8000000000000000;
      auVar32 = vpcmpeqd_avx2(auVar32,auVar32);
      do {
        auVar33._8_8_ = uVar22;
        auVar33._0_8_ = uVar22;
        auVar33._16_8_ = uVar22;
        auVar33._24_8_ = uVar22;
        auVar34 = vpor_avx2(auVar33,auVar6);
        auVar33 = vpor_avx2(auVar33,auVar7);
        auVar33 = vpcmpgtq_avx2(auVar33 ^ auVar26,auVar30 ^ auVar26);
        auVar34 = vpcmpgtq_avx2(auVar34 ^ auVar26,auVar30 ^ auVar26);
        auVar33 = vpackssdw_avx2(auVar34,auVar33);
        auVar5 = vpackssdw_avx(SUB3216(auVar33 ^ auVar32,0),SUB3216(auVar33 ^ auVar32,0x10));
        auVar5 = vpshufd_avx(auVar5,0xd8);
        auVar33 = vpmovzxwd_avx2(auVar5);
        auVar35 = vpslld_avx2(auVar33,0x1f);
        auVar33 = vpmaskmovd_avx2(auVar35,*(undefined1 (*) [32])((long)local_720.m + uVar22 * 4));
        auVar33 = vcvtdq2ps_avx(auVar33);
        auVar34._4_4_ = auVar33._4_4_ * 0.0625;
        auVar34._0_4_ = auVar33._0_4_ * 0.0625;
        auVar34._8_4_ = auVar33._8_4_ * 0.0625;
        auVar34._12_4_ = auVar33._12_4_ * 0.0625;
        auVar34._16_4_ = auVar33._16_4_ * 0.0625;
        auVar34._20_4_ = auVar33._20_4_ * 0.0625;
        auVar34._24_4_ = auVar33._24_4_ * 0.0625;
        auVar34._28_4_ = auVar33._28_4_;
        auVar33 = vmaskmovps_avx(auVar35,auVar34);
        *(undefined1 (*) [32])(info->weight_values_plane1 + uVar22) = auVar33;
        auVar5 = vpand_avx(auVar5,auVar24);
        auVar33 = vpmovzxwd_avx2(auVar5);
        auVar34 = vpslld_avx2(auVar33,0x1f);
        auVar33 = vpmaskmovd_avx2(auVar34,*(undefined1 (*) [32])(local_3c0 + uVar22 * 4));
        auVar33 = vcvtdq2ps_avx(auVar33);
        auVar35._4_4_ = auVar33._4_4_ * 0.0625;
        auVar35._0_4_ = auVar33._0_4_ * 0.0625;
        auVar35._8_4_ = auVar33._8_4_ * 0.0625;
        auVar35._12_4_ = auVar33._12_4_ * 0.0625;
        auVar35._16_4_ = auVar33._16_4_ * 0.0625;
        auVar35._20_4_ = auVar33._20_4_ * 0.0625;
        auVar35._24_4_ = auVar33._24_4_ * 0.0625;
        auVar35._28_4_ = auVar33._28_4_;
        auVar33 = vmaskmovps_avx(auVar34,auVar35);
        *(undefined1 (*) [32])(info->weight_values_plane2 + uVar22) = auVar33;
        uVar22 = uVar22 + 8;
      } while ((bVar2 + 7 & 0xfffffff8) != uVar22);
    }
    if (this->texel_count != '\0') {
      uVar22 = 0;
      do {
        info->partition_assignment[uVar22] = local_8a8->partition_of_texel[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar22 < this->texel_count);
    }
  }
  return ASTCENC_SUCCESS;
}

Assistant:

astcenc_error astcenc_get_block_info(
	astcenc_context* ctxo,
	const uint8_t data[16],
	astcenc_block_info* info
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)data;
	(void)info;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;

	// Decode the compressed data into a symbolic form
	symbolic_compressed_block scb;
	physical_to_symbolic(*ctx->bsd, data, scb);

	// Fetch the appropriate partition and decimation tables
	block_size_descriptor& bsd = *ctx->bsd;

	// Start from a clean slate
	memset(info, 0, sizeof(*info));

	// Basic info we can always populate
	info->profile = ctx->config.profile;

	info->block_x = ctx->config.block_x;
	info->block_y = ctx->config.block_y;
	info->block_z = ctx->config.block_z;
	info->texel_count = bsd.texel_count;

	// Check for error blocks first
	info->is_error_block = scb.block_type == SYM_BTYPE_ERROR;
	if (info->is_error_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Check for constant color blocks second
	info->is_constant_block = scb.block_type == SYM_BTYPE_CONST_F16 ||
	                          scb.block_type == SYM_BTYPE_CONST_U16;
	if (info->is_constant_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Otherwise handle a full block ; known to be valid after conditions above have been checked
	int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	const decimation_info& di = bsd.get_decimation_info(bm.decimation_mode);

	info->weight_x = di.weight_x;
	info->weight_y = di.weight_y;
	info->weight_z = di.weight_z;

	info->is_dual_plane_block = bm.is_dual_plane != 0;

	info->partition_count = scb.partition_count;
	info->partition_index = scb.partition_index;
	info->dual_plane_component = scb.plane2_component;

	info->color_level_count = get_quant_level(scb.get_color_quant_mode());
	info->weight_level_count = get_quant_level(bm.get_weight_quant_mode());

	// Unpack color endpoints for each active partition
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		bool rgb_hdr;
		bool a_hdr;
		vint4 endpnt[2];

		unpack_color_endpoints(ctx->config.profile,
		                       scb.color_formats[i],
		                       scb.color_values[i],
		                       rgb_hdr, a_hdr,
		                       endpnt[0], endpnt[1]);

		// Store the color endpoint mode info
		info->color_endpoint_modes[i] = scb.color_formats[i];
		info->is_hdr_block = info->is_hdr_block || rgb_hdr || a_hdr;

		// Store the unpacked and decoded color endpoint
		vmask4 hdr_mask(rgb_hdr, rgb_hdr, rgb_hdr, a_hdr);
		for (int j = 0; j < 2; j++)
		{
			vint4 color_lns = lns_to_sf16(endpnt[j]);
			vint4 color_unorm = unorm16_to_sf16(endpnt[j]);
			vint4 datai = select(color_unorm, color_lns, hdr_mask);
			store(float16_to_float(datai), info->color_endpoints[i][j]);
		}
	}

	// Unpack weights for each texel
	int weight_plane1[BLOCK_MAX_TEXELS];
	int weight_plane2[BLOCK_MAX_TEXELS];

	unpack_weights(bsd, scb, di, bm.is_dual_plane, weight_plane1, weight_plane2);
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->weight_values_plane1[i] = static_cast<float>(weight_plane1[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		if (info->is_dual_plane_block)
		{
			info->weight_values_plane2[i] = static_cast<float>(weight_plane2[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		}
	}

	// Unpack partition assignments for each texel
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->partition_assignment[i] = pi.partition_of_texel[i];
	}

	return ASTCENC_SUCCESS;
#endif
}